

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall
r_comp::Decompiler::decompile_object
          (Decompiler *this,uint16_t object_index,ostringstream *stream,uint64_t time_offset)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  ushort uVar4;
  OutStream *pOVar5;
  SysObject **ppSVar6;
  reference ppSVar7;
  mapped_type *pmVar8;
  offset_in_Decompiler_to_subr *poVar9;
  size_t sVar10;
  SysView **ppSVar11;
  long *plVar12;
  code *local_128;
  ushort local_c4;
  string local_c0 [4];
  uint16_t i;
  uint16_t view_count;
  string s;
  _Node_iterator_base<unsigned_short,_false> local_a0;
  key_type local_92;
  _Node_iterator_base<unsigned_short,_false> local_90;
  SysObject *local_88;
  SysObject *object;
  iterator __end2;
  iterator __begin2;
  vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_> *__range2;
  _Node_iterator_base<unsigned_short,_false> _Stack_60;
  bool imported;
  key_type local_52;
  _Node_iterator_base<unsigned_short,_false> local_50;
  ushort local_42;
  SysObject *pSStack_40;
  uint16_t read_index;
  SysObject *sys_object;
  uint64_t local_28;
  uint64_t time_offset_local;
  ostringstream *stream_local;
  Decompiler *pDStack_10;
  uint16_t object_index_local;
  Decompiler *this_local;
  
  local_28 = time_offset;
  time_offset_local = (uint64_t)stream;
  stream_local._6_2_ = object_index;
  pDStack_10 = this;
  if (this->out_stream == (OutStream *)0x0) {
    pOVar5 = (OutStream *)operator_new(0x40);
    OutStream::OutStream(pOVar5,(ostringstream *)time_offset_local);
    this->out_stream = pOVar5;
  }
  else if (this->out_stream->stream != stream) {
    pOVar5 = this->out_stream;
    if (pOVar5 != (OutStream *)0x0) {
      OutStream::~OutStream(pOVar5);
      operator_delete(pOVar5);
    }
    pOVar5 = (OutStream *)operator_new(0x40);
    OutStream::OutStream(pOVar5,(ostringstream *)time_offset_local);
    this->out_stream = pOVar5;
  }
  this->time_offset = local_28;
  std::
  unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->variable_names);
  this->last_variable_id = 0;
  ppSVar6 = r_code::vector<r_code::SysObject_*>::operator[]
                      (&(this->image->code_segment).objects,(ulong)stream_local._6_2_);
  this->current_object = (ImageObject *)*ppSVar6;
  pSStack_40 = (SysObject *)this->current_object;
  local_42 = 0;
  this->indents = 0;
  if (((this->partial_decompilation & 1U) == 0) && ((this->ignore_named_objects & 1U) != 0)) {
    local_52 = (key_type)*(undefined4 *)(pSStack_40 + 0x68);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
         ::find(&this->named_objects,&local_52);
    _Stack_60._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
         ::end(&this->named_objects);
    bVar1 = std::__detail::operator!=(&local_50,&stack0xffffffffffffffa0);
    if (bVar1) {
      return;
    }
  }
  else {
    bVar1 = false;
    __end2 = std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::begin
                       (&this->imported_objects);
    object = (SysObject *)
             std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::end
                       (&this->imported_objects);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<r_code::SysObject_**,_std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>_>
                                       *)&object), bVar2) {
      ppSVar7 = __gnu_cxx::
                __normal_iterator<r_code::SysObject_**,_std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>_>
                ::operator*(&__end2);
      local_88 = *ppSVar7;
      if (pSStack_40 == local_88) {
        bVar1 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<r_code::SysObject_**,_std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      local_92 = (key_type)*(undefined4 *)(pSStack_40 + 0x68);
      local_90._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
           ::find(&this->named_objects,&local_92);
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
           ::end(&this->named_objects);
      bVar1 = std::__detail::operator!=(&local_90,&local_a0);
      if (bVar1) {
        return;
      }
      OutStream::operator<<(this->out_stream,(char (*) [10])"imported\n");
    }
  }
  pmVar8 = std::
           unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->object_names,(key_type *)((long)&stream_local + 6));
  std::__cxx11::string::string(local_c0,(string *)pmVar8);
  std::__cxx11::string::operator+=(local_c0,":");
  OutStream::operator<<
            (this->out_stream,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  this->horizontal_set = false;
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_42);
  uVar4 = r_code::Atom::asOpcode();
  poVar9 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                     (&this->renderers,(ulong)uVar4);
  local_128 = (code *)*poVar9;
  plVar12 = (long *)((long)&this->out_stream + poVar9[1]);
  if (((ulong)local_128 & 1) != 0) {
    local_128 = *(code **)(local_128 + *plVar12 + -1);
  }
  (*local_128)(plVar12,local_42);
  sVar10 = r_code::vector<r_code::SysView_*>::size((vector<r_code::SysView_*> *)(pSStack_40 + 0x50))
  ;
  if ((ushort)sVar10 == 0) {
    OutStream::operator<<(this->out_stream,(char (*) [5])" |[]");
  }
  else {
    OutStream::operator<<(this->out_stream,(char (*) [4])" []");
    for (local_c4 = 0; local_c4 < (ushort)sVar10; local_c4 = local_c4 + 1) {
      write_indent(this,3);
      ppSVar11 = r_code::vector<r_code::SysView_*>::operator[]
                           ((vector<r_code::SysView_*> *)(pSStack_40 + 0x50),(ulong)local_c4);
      this->current_object = (ImageObject *)*ppSVar11;
      r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),0)
      ;
      bVar3 = r_code::Atom::getAtomCount();
      write_view(this,0,(ushort)bVar3);
    }
  }
  write_indent(this,0);
  write_indent(this,0);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void Decompiler::decompile_object(uint16_t object_index, std::ostringstream *stream, uint64_t time_offset)
{
    if (!out_stream) {
        out_stream = new OutStream(stream);
    } else if (out_stream->stream != stream) {
        delete out_stream;
        out_stream = new OutStream(stream);
    }

    this->time_offset = time_offset;
    variable_names.clear();
    last_variable_id = 0;
    current_object = image->code_segment.objects[object_index];
    SysObject *sys_object = (SysObject *)current_object;
    uint16_t read_index = 0;
    indents = 0;

    if (!partial_decompilation && ignore_named_objects) { // decompilation of the entire memory.
        if (named_objects.find(sys_object->oid) != named_objects.end()) {
            return;
        }
    } else { // decompiling on-the-fly: ignore named objects only if imported.
        bool imported = false;

        for (SysObject *object : imported_objects) {
            if (sys_object == object) {
                imported = true;
                break;
            }
        }

        if (imported) {
            if (named_objects.find(sys_object->oid) != named_objects.end()) {
                return;
            } else {
                *out_stream << "imported\n";
            }
        } else if (sys_object->oid != UINT32_MAX) {
//            *out_stream << "oid: " << sys_object->oid << "\n";
        }
    }

    std::string s = object_names[object_index];
    s += ":";
    *out_stream << s;
    horizontal_set = false;
    (this->*renderers[current_object->code[read_index].asOpcode()])(read_index);
    uint16_t view_count = sys_object->views.size();

    if (view_count) { // write the set of views
        *out_stream << " []";

        for (uint16_t i = 0; i < view_count; ++i) {
            write_indent(3);
            current_object = sys_object->views[i];
            write_view(0, current_object->code[0].getAtomCount());
        }
    } else {
        *out_stream << " |[]";
    }

    write_indent(0);
    write_indent(0);
}